

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O2

CURLcode pop3_perform_authentication(Curl_easy *data,connectdata *conn)

{
  unsigned_short *sasl;
  curl_trc_feat *pcVar1;
  byte bVar2;
  _Bool _Var3;
  CURLcode CVar4;
  saslprogress sVar5;
  saslprogress progress;
  
  progress = SASL_IDLE;
  sasl = &(conn->proto).imapc.sasl.authmechs;
  _Var3 = Curl_sasl_can_authenticate((SASL *)sasl,data);
  if (_Var3) {
    if (((conn->proto).pop3c.authtypes & (conn->proto).pop3c.preftype & 4) == 0) {
      CVar4 = CURLE_OK;
      sVar5 = SASL_IDLE;
    }
    else {
      CVar4 = Curl_sasl_start((SASL *)sasl,data,false,&progress);
      sVar5 = progress;
      if (progress == SASL_INPROGRESS && CVar4 == CURLE_OK) {
        (data->conn->proto).pop3c.state = POP3_AUTH;
        return CURLE_OK;
      }
    }
    if (sVar5 == SASL_IDLE && CVar4 == CURLE_OK) {
      bVar2 = (conn->proto).pop3c.preftype & (conn->proto).pop3c.authtypes;
      if ((bVar2 & 2) == 0) {
        if ((bVar2 & 1) == 0) {
          CVar4 = CURLE_LOGIN_DENIED;
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
             ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
              (0 < pcVar1->log_level)))) {
            Curl_infof(data,"No known authentication mechanisms supported");
          }
        }
        else {
          CVar4 = pop3_perform_user(data,conn);
        }
      }
      else {
        CVar4 = pop3_perform_apop(data,conn);
      }
    }
  }
  else {
    (data->conn->proto).pop3c.state = POP3_STOP;
    CVar4 = CURLE_OK;
  }
  return CVar4;
}

Assistant:

static CURLcode pop3_perform_authentication(struct Curl_easy *data,
                                            struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  saslprogress progress = SASL_IDLE;

  /* Check we have enough data to authenticate with and end the
     connect phase if we do not */
  if(!Curl_sasl_can_authenticate(&pop3c->sasl, data)) {
    pop3_state(data, POP3_STOP);
    return result;
  }

  if(pop3c->authtypes & pop3c->preftype & POP3_TYPE_SASL) {
    /* Calculate the SASL login details */
    result = Curl_sasl_start(&pop3c->sasl, data, FALSE, &progress);

    if(!result)
      if(progress == SASL_INPROGRESS)
        pop3_state(data, POP3_AUTH);
  }

  if(!result && progress == SASL_IDLE) {
#ifndef CURL_DISABLE_DIGEST_AUTH
    if(pop3c->authtypes & pop3c->preftype & POP3_TYPE_APOP)
      /* Perform APOP authentication */
      result = pop3_perform_apop(data, conn);
    else
#endif
    if(pop3c->authtypes & pop3c->preftype & POP3_TYPE_CLEARTEXT)
      /* Perform clear text authentication */
      result = pop3_perform_user(data, conn);
    else {
      /* Other mechanisms not supported */
      infof(data, "No known authentication mechanisms supported");
      result = CURLE_LOGIN_DENIED;
    }
  }

  return result;
}